

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O0

string * limonp::Trim(string *s)

{
  string *psVar1;
  string *in_stack_00000050;
  
  RTrim(in_stack_00000050);
  psVar1 = LTrim(in_stack_00000050);
  return psVar1;
}

Assistant:

inline std::string& Trim(std::string &s) {
  return LTrim(RTrim(s));
}